

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_tan(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  char *pcVar2;
  byte bVar3;
  err_frame_t *peVar4;
  CVmException *pCVar5;
  int iVar6;
  char *pcVar7;
  byte bVar8;
  CVmObjBigNum *this_00;
  size_t prec;
  long *in_FS_OFFSET;
  char *ext1;
  char *ext7;
  char *ext2;
  char *ext8;
  char *ext6;
  uint hdl9;
  uint hdl8;
  uint hdl7;
  uint hdl6;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext9;
  char *ext5;
  char *ext4;
  char *ext3;
  char *local_120;
  char *new_ext;
  err_frame_t err_cur__;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  iVar6 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar6 == 0) {
    prec = (ulong)uVar1 + 3;
    local_120 = cache_pi(prec);
    alloc_temp_regs(prec,9,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4,&ext5,&hdl5,&ext6,&hdl6,
                    &ext7,&hdl7,&ext8,&hdl8,&ext9,&hdl9);
    G_err_frame::__tls_init();
    err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    pcVar7 = local_120;
    if (err_cur__.state_ == 0) {
      copy_val(ext1,(this->super_CVmObject).ext_,0);
      bVar8 = ext1[4];
      ext1[4] = bVar8 & 0xfe;
      copy_val(ext7,pcVar7,1);
      mul_by_long(ext7,2);
      while (iVar6 = compare_abs(ext1,ext7), 0 < iVar6) {
        compute_quotient_into(ext6,ext2,ext1,ext7);
        pcVar2 = ext1;
        ext1 = ext2;
        ext2 = pcVar2;
      }
      copy_val(ext7,pcVar7,1);
      iVar6 = compare_abs(ext1,ext7);
      if (0 < iVar6) {
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar2 = ext1;
        ext1 = ext2;
        ext2 = pcVar2;
      }
      div_by_long(ext7,2,(unsigned_long *)0x0);
      iVar6 = compare_abs(ext1,ext7);
      if (0 < iVar6) {
        copy_val(ext7,pcVar7,1);
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar2 = ext1;
        ext1 = ext2;
        ext2 = pcVar2;
      }
      bVar8 = (bVar8 ^ ext1[4]) & 1;
      ext1[4] = ext1[4] & 0xfe;
      copy_val(ext7,pcVar7,1);
      div_by_long(ext7,4,(unsigned_long *)0x0);
      iVar6 = compare_abs(ext1,ext7);
      if (0 < iVar6) {
        copy_val(ext7,pcVar7,1);
        div_by_long(ext7,2,(unsigned_long *)0x0);
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar7 = ext1;
        bVar3 = bVar8 ^ 1;
        if ((ext1[4] & 1U) == 0) {
          bVar3 = bVar8;
        }
        ext1[4] = ext1[4] & 0xfe;
        ext1 = ext2;
        ext2 = pcVar7;
        bVar8 = bVar3;
      }
      this_00 = (CVmObjBigNum *)ext9;
      copy_val(ext9,ext1,0);
      calc_sin_series(this_00,ext8,ext1,ext2,ext3,ext4,ext5,ext6,ext7);
      calc_cos_series(this_00,ext1,ext9,ext2,ext3,ext4,ext5,ext6,ext7);
      pcVar7 = ext1;
      if (0 < iVar6) {
        pcVar7 = ext8;
        ext8 = ext1;
      }
      compute_quotient_into(new_ext,(char *)0x0,ext8,pcVar7);
      new_ext[4] = bVar8 | new_ext[4] & 0xfeU;
      normalize(new_ext);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      release_temp_regs(9,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4,(ulong)hdl5,(ulong)hdl6,
                        (ulong)hdl7,(ulong)hdl8,(ulong)hdl9);
    }
    peVar4 = err_cur__.prv_;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)peVar4;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pCVar5 = err_cur__.exc_;
      G_err_frame::__tls_init();
      *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar5;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_tan(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3, hdl4, hdl5, hdl6, hdl7, hdl8, hdl9;
    char *ext1, *ext2, *ext3, *ext4, *ext5, *ext6, *ext7, *ext8, *ext9;
    int neg_result;
    int invert_result;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to the working precision */
    pi = cache_pi(prec + 3);

    /* 
     *   Allocate our temporary registers for sin() and cos()
     *   calculations, plus two extra: one to hold the sine while we're
     *   calculating the cosine, and the other to hold the cosine result.
     *   
     *   (We could make do with fewer registers by copying values around,
     *   but if the numbers are of very high precision it's much cheaper
     *   to allocate more registers, since the registers come out of the
     *   register cache and probably won't require any actual memory
     *   allocation.)  
     */
    alloc_temp_regs(prec + 3, 9,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5, &ext6, &hdl6,
                    &ext7, &hdl7, &ext8, &hdl8, &ext9, &hdl9);

    /* protect against errors so we definitely free the registers */
    err_try
    {
        char *tmp;

        /* presume we won't have to invert our result */
        invert_result = FALSE;

        /* copy our initial value to ext1 */
        copy_val(ext1, ext_, FALSE);

        /* note that tan(-x) = -tan(x) - if x < 0, use -x */
        neg_result = get_neg(ext1);
        set_neg(ext1, FALSE);

        /* reduce the argument modulo 2*pi */
        copy_val(ext7, pi, TRUE);
        mul_by_long(ext7, 2);
        while (compare_abs(ext1, ext7) > 0)
        {
            /* divide by 2*pi, storing the remainder in r2 */
            compute_quotient_into(ext6, ext2, ext1, ext7);

            /* swap r2 into r1 for the next round */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /* 
         *   Next, note that tan(x+pi) = tan(x).  So, if x > pi, the
         *   argument by pi.  This will reduce our range to 0 <= x <= pi.  
         */
        copy_val(ext7, pi, TRUE);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* subtract pi from the argument */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   Use the fact that tan(x + pi) = tan(x) once again: if x >
         *   pi/2, subtract pi from x to adjust the range to -pi/2 <= x <=
         *   pi/2.  
         */
        div_by_long(ext7, 2);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* subtract pi from the argument */
            copy_val(ext7, pi, TRUE);
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   once again, reduce our range using the sign equivalence -
         *   this will limit our range to 0 <= x <= pi/2 
         */
        if (get_neg(ext1))
            neg_result = !neg_result;
        set_neg(ext1, FALSE);

        /*
         *   Next, observe that tan(x+pi/2) = 1/tan(x).  If x > pi/4,
         *   invert the result.  
         */
        copy_val(ext7, pi, TRUE);
        div_by_long(ext7, 4);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* calculate pi/2 */
            copy_val(ext7, pi, TRUE);
            div_by_long(ext7, 2);
            
            /* subtract pi/2 to get into range -pi/4 <= x <= pi/4 */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* sin(-x) = -sin(x) */
            if (get_neg(ext1))
                neg_result = !neg_result;
            set_neg(ext1, FALSE);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;

            /* note that we must invert the result */
            invert_result = TRUE;
        }

        /* 
         *   make a copy of our argument value in ext9 for safekeeping
         *   while we're calculating the sine 
         */
        copy_val(ext9, ext1, FALSE);

        /*
         *   We now have a value in the range 0 <= x <= pi/4, which will
         *   converge quickly with our Taylor series for sine and cosine.
         *   This will also ensure that both sin and cos are non-negative,
         *   so the sign we calculated for the tangent is all that matters
         *   for the sign.
         *   
         *   First, Calculate the sine and store the result in r8.  
         */
        calc_sin_series(vmg_ ext8,
                        ext1, ext2, ext3, ext4, ext5, ext6, ext7);

        /* 
         *   Calculate the cosine and store the result in r1.  Note that
         *   we saved the argument value in ext9 while we were working on
         *   the sine, so we can now use that value as the argument here.
         *   ext1 was trashed by the sine calculation, so just use it as
         *   the output register here.  
         */
        calc_cos_series(vmg_ ext1,
                        ext9, ext2, ext3, ext4, ext5, ext6, ext7);

        /* calculate the quotient sin/cos, or cos/sin if inverted */
        if (invert_result)
            compute_quotient_into(new_ext, 0, ext1, ext8);
        else
            compute_quotient_into(new_ext, 0, ext8, ext1);

        /* negate the result if necessary */
        set_neg(new_ext, neg_result);

        /* normalize the result */
        normalize(new_ext);
    }